

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11TextureCalc.h
# Opt level: O2

GMM_GFX_SIZE_T __thiscall
GmmLib::GmmGen11TextureCalc::GmmTexGetMipWidth
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t MipLevel)

{
  ulong uVar1;
  GMM_GFX_SIZE_T GVar2;
  
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    GVar2 = 0;
  }
  else {
    uVar1 = pTexInfo->BaseWidth;
    if (((ulong)(pTexInfo->Flags).Info & 0x10) == 0) {
      uVar1 = uVar1 >> ((byte)MipLevel & 0x3f);
      GVar2 = uVar1 + (uVar1 == 0);
    }
    else if (uVar1 == 1) {
      GVar2 = 1;
    }
    else {
      uVar1 = uVar1 - 1 >> ((byte)MipLevel & 0x3f);
      GVar2 = 2;
      if (uVar1 != 0) {
        GVar2 = uVar1 + 1;
      }
    }
  }
  return GVar2;
}

Assistant:

virtual GMM_GFX_SIZE_T  GmmTexGetMipWidth(GMM_TEXTURE_INFO *pTexInfo, uint32_t MipLevel)
            {
                __GMM_ASSERTPTR(pTexInfo, 0);

                if (!pTexInfo->Flags.Info.CornerTexelMode)
                {
                    return(GFX_MAX(1, pTexInfo->BaseWidth >> MipLevel));
                }
                else
                {
                    if (pTexInfo->BaseWidth == 1)
                    {
                        return pTexInfo->BaseWidth;
                    }
                    else
                    {
                        return(GFX_MAX(1, (pTexInfo->BaseWidth - 1) >> MipLevel) + 1);
                    }
                }
            }